

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

void elf_dynreloc(ObjectUnit *ou,Reloc *r,int relafmt,size_t elfrelsize)

{
  byte bVar1;
  Symbol *sym;
  byte bVar2;
  Section *pSVar3;
  byte bVar4;
  char *name;
  Section **unaff_R12;
  
  bVar1 = r->rtype;
  bVar4 = 0x40;
  bVar2 = 0x40;
  switch(bVar1) {
  case 0xe:
    bVar2 = 0x80;
  case 6:
  case 0xd:
    bVar4 = bVar2;
    name = dynrel_name[relafmt != 0];
    r->flags = r->flags | 0x80;
    unaff_R12 = &elfdynrelocs;
    break;
  case 0xf:
    name = pltrel_name[relafmt != 0];
    r->flags = r->flags | 0x40;
    unaff_R12 = &elfpltrelocs;
    break;
  default:
    if (bVar1 == 1) {
      return;
    }
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    name = reloc_name[bVar1];
    ierror("elf_dynreloc(): wrong rtype %s (%d)");
    bVar4 = 0x40;
  }
  if (*unaff_R12 == (Section *)0x0) {
    pSVar3 = add_section(ou,name,(uint8_t *)0x0,0,'\x02','\x01','\x01','\x02',1);
    *unaff_R12 = pSVar3;
  }
  (*unaff_R12)->size = (*unaff_R12)->size + elfrelsize;
  if (r->xrefname != (char *)0x0) {
    sym = (r->relocsect).symbol;
    if (sym->flags < 0x40) {
      sym->flags = sym->flags | bVar4;
      elf_adddynsym(sym);
      return;
    }
  }
  return;
}

Assistant:

void elf_dynreloc(struct ObjectUnit *ou,struct Reloc *r,int relafmt,
                  size_t elfrelsize)
{
  const char *secname;
  struct Section **secp;
  uint8_t dynflag = SYMF_DYNIMPORT;

  switch (r->rtype) {
    case R_COPY:
      dynflag = SYMF_DYNEXPORT;
      /* fall through */
    case R_GLOBDAT:
    case R_LOADREL:
      secp = &elfdynrelocs;
      secname = dynrel_name[relafmt?1:0];
      r->flags |= RELF_DYN;
      break;
    case R_JMPSLOT:
      secp = &elfpltrelocs;
      secname = pltrel_name[relafmt?1:0];
      r->flags |= RELF_PLT;
      break;
    case R_ABS:
      return;
    default:
      ierror("elf_dynreloc(): wrong rtype %s (%d)",
             reloc_name[r->rtype],(int)r->rtype);
      break;
  }

  /* make sure that dynamic relocation section exists */
  if (*secp == NULL)
    *secp = add_section(ou,secname,NULL,0,ST_DATA,SF_ALLOC,SP_READ,2,TRUE);

  /* increase size for new entry */
  (*secp)->size += elfrelsize;
  
  /* allocate referenced symbol in .dynsym and .dynstr */
  if (r->xrefname) {
    struct Symbol *sym = r->relocsect.symbol;

    if (!(sym->flags & SYMF_DYNLINK)) {
      /* add symbol to .dynsym symbol list, if not already present */
      sym->flags |= dynflag;
      elf_adddynsym(sym);
    }
  }
}